

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-server.c
# Opt level: O2

void ssh2_userauth_server_free(PacketProtocolLayer *ppl)

{
  if (*(PacketProtocolLayer **)&ppl[-2].remote_bugs != (PacketProtocolLayer *)0x0) {
    ssh_ppl_free(*(PacketProtocolLayer **)&ppl[-2].remote_bugs);
  }
  free_auth_kbdint(*(AuthKbdInt **)&ppl[-1].remote_bugs);
  safefree(&ppl[-2].interactor);
  return;
}

Assistant:

static void ssh2_userauth_server_free(PacketProtocolLayer *ppl)
{
    struct ssh2_userauth_server_state *s =
        container_of(ppl, struct ssh2_userauth_server_state, ppl);

    if (s->successor_layer)
        ssh_ppl_free(s->successor_layer);

    free_auth_kbdint(s->aki);

    sfree(s);
}